

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode
JsSetRuntimeDomWrapperTracingCallbacks
          (JsRuntimeHandle runtimeHandle,JsRef wrapperTracingState,
          JsDOMWrapperTracingCallback wrapperTracingCallback,
          JsDOMWrapperTracingDoneCallback wrapperTracingDoneCallback,
          JsDOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)

{
  ThreadContext *threadContext;
  JsrtRuntime *pJVar1;
  JsErrorCode JVar2;
  AutoNestedHandledExceptionType local_68 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar2 = JsErrorInvalidArgument;
  }
  else {
    pJVar1 = JsrtRuntime::FromHandle(runtimeHandle);
    threadContext = pJVar1->threadContext;
    ThreadContextScope::ThreadContextScope
              ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage,threadContext);
    JVar2 = JsErrorWrongThread;
    if (anon_var_0.m_staticAbortMessage._1_1_ == '\x01') {
      JVar2 = JsNoError;
      Memory::Recycler::SetDOMWrapperTracingCallback
                (threadContext->recycler,wrapperTracingState,wrapperTracingCallback,
                 wrapperTracingDoneCallback,enterFinalPauseCallback);
    }
    ThreadContextScope::~ThreadContextScope((ThreadContextScope *)&anon_var_0.m_staticAbortMessage);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
  return JVar2;
}

Assistant:

CHAKRA_API
JsSetRuntimeDomWrapperTracingCallbacks(
    _In_ JsRuntimeHandle runtimeHandle,
    _In_ JsRef wrapperTracingState,
    _In_ JsDOMWrapperTracingCallback wrapperTracingCallback,
    _In_ JsDOMWrapperTracingDoneCallback wrapperTracingDoneCallback,
    _In_ JsDOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        Recycler * recycler = threadContext->GetRecycler();
        recycler->SetDOMWrapperTracingCallback(wrapperTracingState, reinterpret_cast<DOMWrapperTracingCallback>(wrapperTracingCallback), reinterpret_cast<DOMWrapperTracingDoneCallback>(wrapperTracingDoneCallback), reinterpret_cast<DOMWrapperTracingEnterFinalPauseCallback>(enterFinalPauseCallback));
        return JsNoError;
    });
}